

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O3

void __thiscall pg::PPSolver::setDominion(PPSolver *this,int p)

{
  int node;
  int *piVar1;
  char cVar2;
  ostream *poVar3;
  bool bVar4;
  int strategy;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  
  if ((this->super_Solver).trace != 0) {
    poVar3 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\x1b[1;38;5;201mdominion \x1b[36m",0x1b);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m",3);
  }
  piVar8 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar8 != piVar1) {
    bVar4 = (bool)((byte)p & 1);
    do {
      node = *piVar8;
      uVar6 = (ulong)node;
      if (this->region[uVar6] != p) {
        __assert_fail("region[i] == p",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                      ,0xda,"void pg::PPSolver::setDominion(int)");
      }
      uVar7 = 1L << (uVar6 & 0x3f);
      uVar5 = (((this->super_Solver).game)->_owner)._bits[uVar6 >> 6] & uVar7;
      if (((uVar5 == 0) != bVar4) &&
         (((long)this->strategy[uVar6] == -1 || (this->region[this->strategy[uVar6]] != p)))) {
        __assert_fail("owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                      ,0xdb,"void pg::PPSolver::setDominion(int)");
      }
      if (1 < (this->super_Solver).trace) {
        poVar3 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        std::ostream::operator<<(poVar3,node);
        uVar5 = uVar7 & (((this->super_Solver).game)->_owner)._bits[uVar6 >> 6];
      }
      strategy = -1;
      if ((uVar5 == 0) != bVar4) {
        strategy = this->strategy[uVar6];
      }
      Oink::solve((this->super_Solver).oink,node,p & 1,strategy);
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar1);
  }
  if ((this->super_Solver).trace != 0) {
    poVar3 = (this->super_Solver).logger;
    cVar2 = (char)poVar3;
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  Oink::flush((this->super_Solver).oink);
  return;
}

Assistant:

void
PPSolver::setDominion(int p)
{
    // found a dominion
    const int pl = p&1;
    if (trace) logger << "\033[1;38;5;201mdominion \033[36m" << p << "\033[m";
    for (int i : regions[p]) {
        assert(region[i] == p);
        assert(owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p));
#ifndef NDEBUG
        if (trace >= 2) logger << " " << i;
#endif
        Solver::solve(i, pl, owner(i) == pl ? strategy[i] : -1);
    }
    if (trace) logger << std::endl;
    Solver::flush();
}